

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O2

_Bool parse_semicolon(gravity_parser_t *parser)

{
  gravity_lexer_t *lexer;
  gtoken_t gVar1;
  
  lexer = parser->lexer->p[parser->lexer->n - 1];
  gVar1 = gravity_lexer_peek(lexer);
  if (gVar1 == TOK_OP_SEMICOLON) {
    gVar1 = gravity_lexer_next(lexer);
    return SUB41(gVar1,0);
  }
  return SUB41(gVar1,0);
}

Assistant:

static bool parse_semicolon (gravity_parser_t *parser) {
    #if SEMICOLON_IS_OPTIONAL
    DECLARE_LEXER;
    if (gravity_lexer_peek(lexer) == TOK_OP_SEMICOLON) {gravity_lexer_next(lexer); return true;}
    return false;
    #else
    return parse_required(parser, TOK_OP_SEMICOLON);
    #endif
}